

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryCompressedTTF
          (ImFontAtlas *this,void *compressed_ttf_data,int compressed_ttf_size,float size_pixels,
          ImFontConfig *font_cfg_template,ImWchar *glyph_ranges)

{
  uint ttf_size;
  ImFont *pIVar1;
  undefined1 local_c8 [8];
  ImFontConfig font_cfg;
  uchar *buf_decompressed_data;
  uint buf_decompressed_size;
  ImWchar *glyph_ranges_local;
  ImFontConfig *font_cfg_template_local;
  float size_pixels_local;
  int compressed_ttf_size_local;
  void *compressed_ttf_data_local;
  ImFontAtlas *this_local;
  
  ttf_size = stb_decompress_length((uchar *)compressed_ttf_data);
  font_cfg.DstFont = (ImFont *)ImGui::MemAlloc((ulong)ttf_size);
  stb_decompress((uchar *)font_cfg.DstFont,(uchar *)compressed_ttf_data,compressed_ttf_size);
  if (font_cfg_template == (ImFontConfig *)0x0) {
    ImFontConfig::ImFontConfig((ImFontConfig *)local_c8);
  }
  else {
    memcpy(local_c8,font_cfg_template,0x88);
  }
  if (local_c8 == (undefined1  [8])0x0) {
    font_cfg.FontData._4_1_ = 1;
    pIVar1 = AddFontFromMemoryTTF
                       (this,font_cfg.DstFont,ttf_size,size_pixels,(ImFontConfig *)local_c8,
                        glyph_ranges);
    return pIVar1;
  }
  __assert_fail("font_cfg.FontData == __null",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_draw.cpp"
                ,0x889,
                "ImFont *ImFontAtlas::AddFontFromMemoryCompressedTTF(const void *, int, float, const ImFontConfig *, const ImWchar *)"
               );
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryCompressedTTF(const void* compressed_ttf_data, int compressed_ttf_size, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    const unsigned int buf_decompressed_size = stb_decompress_length((const unsigned char*)compressed_ttf_data);
    unsigned char* buf_decompressed_data = (unsigned char*)IM_ALLOC(buf_decompressed_size);
    stb_decompress(buf_decompressed_data, (const unsigned char*)compressed_ttf_data, (unsigned int)compressed_ttf_size);

    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    IM_ASSERT(font_cfg.FontData == NULL);
    font_cfg.FontDataOwnedByAtlas = true;
    return AddFontFromMemoryTTF(buf_decompressed_data, (int)buf_decompressed_size, size_pixels, &font_cfg, glyph_ranges);
}